

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_free_extensions(nifti_image *nim)

{
  int local_1c;
  int c;
  nifti_image *nim_local;
  
  if (nim == (nifti_image *)0x0) {
    nim_local._4_4_ = -1;
  }
  else {
    if ((nim->num_ext < 1) || (nim->ext_list == (nifti1_extension *)0x0)) {
      if (((0 < nim->num_ext) || (nim->ext_list != (nifti1_extension *)0x0)) && (0 < g_opts.debug))
      {
        fprintf(_stderr,"** warning: nifti extension num/ptr mismatch (%d,%p)\n",
                (ulong)(uint)nim->num_ext,nim->ext_list);
      }
    }
    else {
      for (local_1c = 0; local_1c < nim->num_ext; local_1c = local_1c + 1) {
        if (nim->ext_list[local_1c].edata != (char *)0x0) {
          free(nim->ext_list[local_1c].edata);
        }
      }
      free(nim->ext_list);
    }
    if (2 < g_opts.debug) {
      fprintf(_stderr,"+d free\'d %d extension(s)\n",(ulong)(uint)nim->num_ext);
    }
    nim->num_ext = 0;
    nim->ext_list = (nifti1_extension *)0x0;
    nim_local._4_4_ = 0;
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_free_extensions( nifti_image *nim )
{
   int c ;
   if( nim == NULL ) return -1;
   if( nim->num_ext > 0 && nim->ext_list ){
      for( c = 0; c < nim->num_ext; c++ )
         if ( nim->ext_list[c].edata ) free(nim->ext_list[c].edata);
      free(nim->ext_list);
   }
   /* or if it is inconsistent, warn the user (if we are not in quiet mode) */
   else if ( (nim->num_ext > 0 || nim->ext_list != NULL) && (g_opts.debug > 0) )
      fprintf(stderr,"** warning: nifti extension num/ptr mismatch (%d,%p)\n",
              nim->num_ext, (void *)nim->ext_list);

   if( g_opts.debug > 2 )
      fprintf(stderr,"+d free'd %d extension(s)\n", nim->num_ext);

   nim->num_ext = 0;
   nim->ext_list = NULL;

   return 0;
}